

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-util.h
# Opt level: O3

void capnp::_::
     checkList<capnp::List<unsigned_long,_(capnp::Kind)0>::Builder,_capnp::List<unsigned_long,_(capnp::Kind)0>,_false>
               (Builder reader,initializer_list<unsigned_long> expected)

{
  int iVar1;
  Exception *pEVar2;
  Exception *pEVar3;
  Exception *pEVar4;
  bool bVar5;
  Fault f;
  Exception *local_40;
  ListElementCount local_34;
  
  pEVar3 = (Exception *)expected._M_len;
  if ((Exception *)(ulong)reader.builder.elementCount == pEVar3) {
    if (pEVar3 != (Exception *)0x0) {
      pEVar2 = (Exception *)0x0;
      pEVar4 = (Exception *)0x1;
      iVar1 = kj::_::Debug::minSeverity;
      do {
        f.exception = (Exception *)expected._M_array[(long)pEVar2];
        local_40 = *(Exception **)
                    (reader.builder.ptr + ((long)pEVar2 * (ulong)reader.builder.step >> 3));
        if ((f.exception != local_40) && (iVar1 < 3)) {
          kj::_::Debug::log<char_const(&)[28],unsigned_long&,unsigned_long&>
                    ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
                     ,0x72,ERROR,"\"failed: expected \" \"(a) == (b)\", a, b",
                     (char (*) [28])"failed: expected (a) == (b)",(unsigned_long *)&f,
                     (unsigned_long *)&local_40);
          iVar1 = kj::_::Debug::minSeverity;
        }
        bVar5 = pEVar4 < pEVar3;
        pEVar2 = pEVar4;
        pEVar4 = (Exception *)(ulong)((int)pEVar4 + 1);
      } while (bVar5);
    }
    return;
  }
  local_34 = reader.builder.elementCount;
  local_40 = pEVar3;
  kj::_::Debug::Fault::Fault<kj::Exception::Type,unsigned_long,unsigned_int>
            (&f,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/test-util.h"
             ,0x89,FAILED,"(expected.size()) == (reader.size())","expected.size(), reader.size()",
             (unsigned_long *)&local_40,&local_34);
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

void checkList(T reader, std::initializer_list<decltype(typename L::Reader()[0])> expected) {
  ASSERT_EQ(expected.size(), reader.size());
  for (uint i = 0; i < expected.size(); i++) {
    checkElement<decltype(typename L::Reader()[0])>(expected.begin()[i], reader[i]);
  }
}